

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_format.hpp
# Opt level: O2

void __thiscall DSFormat::DSFormat(DSFormat *this,VSFormat *format)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  
  this->Planes = format->numPlanes;
  uVar1 = format->bitsPerSample;
  uVar2 = format->bytesPerSample;
  uVar3 = format->subSamplingW;
  uVar4 = format->subSamplingH;
  iVar5 = format->colorFamily;
  this->IsFamilyYUV = iVar5 == 1000000 || iVar5 == 3000000;
  this->SSW = uVar3;
  this->SSH = uVar4;
  this->BitsPerSample = uVar1;
  this->BytesPerSample = uVar2;
  auVar7._0_4_ = -(uint)(iVar5 == 2000000);
  auVar7._4_4_ = -(uint)(iVar5 == 4000000);
  auVar7._8_4_ = -(uint)(format->sampleType == 0);
  auVar7._12_4_ = -(uint)(format->sampleType == 1);
  auVar7 = packssdw(auVar7,auVar7);
  auVar7 = packsswb(auVar7,auVar7);
  uVar6 = auVar7._0_4_ & (uint)DAT_00114060;
  this->IsFamilyRGB = (bool)(char)uVar6;
  this->IsFamilyYCC = (bool)(char)(uVar6 >> 8);
  this->IsInteger = (bool)(char)(uVar6 >> 0x10);
  this->IsFloat = (bool)(char)(uVar6 >> 0x18);
  return;
}

Assistant:

DSFormat(const VSFormat* format)
  {
    Planes = format->numPlanes;
    IsFamilyYUV = format->colorFamily == cmYUV || format->colorFamily == cmGray;
    IsFamilyRGB = format->colorFamily == cmRGB;
    IsFamilyYCC = format->colorFamily == cmYCoCg;
    SSW = format->subSamplingW;
    SSH = format->subSamplingH;
    BitsPerSample = format->bitsPerSample;
    BytesPerSample = format->bytesPerSample;
    IsInteger = format->sampleType == stInteger;
    IsFloat = format->sampleType == stFloat;
  }